

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::AddError(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
           *this,ValueType *keyword,ValueType *error)

{
  undefined8 uVar1;
  CrtAllocator *pCVar2;
  MemberIterator member;
  ValueType errors;
  undefined1 local_40 [16];
  undefined8 uStack_30;
  
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::FindMember<rapidjson::CrtAllocator>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_40,&this->error_)
  ;
  uVar1 = local_40._0_8_;
  if ((this->error_).data_.f.flags == 3) {
    if (local_40._0_8_ ==
        (ulong)(this->error_).data_.s.length * 0x20 +
        ((ulong)(this->error_).data_.s.str & 0xffffffffffff)) {
      if (this->stateAllocator_ == (CrtAllocator *)0x0) {
        pCVar2 = (CrtAllocator *)operator_new(1);
        this->ownStateAllocator_ = pCVar2;
        this->stateAllocator_ = pCVar2;
      }
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
                (&this->error_,keyword,error,this->stateAllocator_);
    }
    else {
      if (*(short *)(local_40._0_8_ + 0x1e) == 3) {
        local_40._8_8_ = (Ch *)0x0;
        uStack_30 = 0x4000000000000;
        if (this->stateAllocator_ == (CrtAllocator *)0x0) {
          pCVar2 = (CrtAllocator *)operator_new(1);
          this->ownStateAllocator_ = pCVar2;
          this->stateAllocator_ = pCVar2;
        }
        GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushBack
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)(local_40 + 8),
                   (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)(uVar1 + 0x10),
                   this->stateAllocator_);
        GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::operator=
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                   (local_40._0_8_ + 0x10),
                   (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)(local_40 + 8));
        GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)(local_40 + 8));
      }
      if (this->stateAllocator_ == (CrtAllocator *)0x0) {
        pCVar2 = (CrtAllocator *)operator_new(1);
        this->ownStateAllocator_ = pCVar2;
        this->stateAllocator_ = pCVar2;
      }
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushBack
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                 (local_40._0_8_ + 0x10),error,this->stateAllocator_);
    }
    return;
  }
  __assert_fail("IsObject()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                ,0x4fd,
                "MemberIterator rapidjson::GenericValue<rapidjson::UTF8<>, rapidjson::CrtAllocator>::MemberEnd() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
               );
}

Assistant:

void AddError(ValueType& keyword, ValueType& error) {
        typename ValueType::MemberIterator member = error_.FindMember(keyword);
        if (member == error_.MemberEnd())
            error_.AddMember(keyword, error, GetStateAllocator());
        else {
            if (member->value.IsObject()) {
                ValueType errors(kArrayType);
                errors.PushBack(member->value, GetStateAllocator());
                member->value = errors;
            }
            member->value.PushBack(error, GetStateAllocator());
        }
    }